

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool __thiscall
google::anon_unknown_10::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  int __fd;
  long *plVar4;
  FILE *pFVar5;
  char *pcVar6;
  long *plVar7;
  long *plVar8;
  bool bVar9;
  string linkpath;
  string linkname;
  string string_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  std::operator+(&local_d0,&this->base_filename_,&this->filename_extension_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(time_pid_string->_M_dataplus)._M_p);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90 = &local_80;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  plVar4 = local_90;
  __fd = open((char *)local_90,0xc1,(ulong)fLI::FLAGS_logfile_mode);
  if (__fd != -1) {
    fcntl(__fd,2,1);
    pFVar5 = fdopen(__fd,"a");
    this->file_ = (FILE *)pFVar5;
    if (pFVar5 != (FILE *)0x0) {
      sVar2 = (this->symlink_basename_)._M_string_length;
      bVar9 = true;
      if (sVar2 != 0) {
        pcVar6 = strrchr((char *)plVar4,0x2f);
        pcVar3 = (this->symlink_basename_)._M_dataplus._M_p;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar3,pcVar3 + sVar2);
        std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_d0._M_string_length,0,'\x01');
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_a0 = *plVar8;
          lStack_98 = plVar7[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar8;
          local_b0 = (long *)*plVar7;
        }
        local_a8 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
        }
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        if (pcVar6 != (char *)0x0) {
          local_50 = &local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,plVar4,pcVar6 + 1);
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
        }
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
        unlink(local_d0._M_dataplus._M_p);
        plVar7 = (long *)(pcVar6 + 1);
        if (pcVar6 == (char *)0x0) {
          plVar7 = plVar4;
        }
        symlink((char *)plVar7,local_d0._M_dataplus._M_p);
        if (fLS::FLAGS_log_link_abi_cxx11_[1] != 0) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,*fLS::FLAGS_log_link_abi_cxx11_,
                     fLS::FLAGS_log_link_abi_cxx11_[1] + *fLS::FLAGS_log_link_abi_cxx11_);
          std::__cxx11::string::append((char *)local_70);
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_b0);
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_40 = *plVar8;
            lStack_38 = plVar7[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar8;
            local_50 = (long *)*plVar7;
          }
          local_48 = plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          unlink(local_d0._M_dataplus._M_p);
          symlink((char *)plVar4,local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
      }
      goto LAB_0011ab28;
    }
    close(__fd);
    unlink((char *)plVar4);
  }
  bVar9 = false;
LAB_0011ab28:
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return bVar9;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  // string string_filename = base_filename_+filename_extension_+
  //                          time_pid_string;
  // @huihut: path + severity + '_' + file name + ".log"
  string string_filename = base_filename_ + filename_extension_ + time_pid_string + ".log";
  const char* filename = string_filename.c_str();
  int fd = open(filename, O_WRONLY | O_CREAT | O_EXCL, FLAGS_logfile_mode);
  if (fd == -1) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd, F_SETFD, FD_CLOEXEC);
#endif

  file_ = fdopen(fd, "a");  // Make a FILE*.
  if (file_ == NULL) {  // Man, we're screwed!
    close(fd);
    unlink(filename);  // Erase the half-baked evidence: an unusable log file
    return false;
  }

  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
      symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if ( slash ) linkpath = string(filename, slash-filename+1);  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());                    // delete old one if it exists

#if defined(OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char *linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());                  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}